

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>_>_>
* __thiscall
Lib::
OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>_>_>
::operator=(OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>_>_>
            *this,OptionBase<Lib::MappingIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>,_Lib::PairRightPushingFn<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>,_std::pair<std::pair<Kernel::Literal_*,_Kernel::TermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>_>_>
                  *other)

{
  long *plVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if ((this->_isSome == true) &&
     (plVar2 = *(long **)((long)&(this->_elem)._elem + 0x10), plVar2 != (long *)0x0)) {
    plVar1 = plVar2 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (other->_isSome == true) {
    uVar6 = *(undefined8 *)&(other->_elem)._elem;
    uVar7 = *(undefined8 *)((long)&(other->_elem)._elem + 8);
    plVar2 = *(long **)((long)&(other->_elem)._elem + 0x10);
    if (plVar2 == (long *)0x0) {
      uVar3 = *(undefined4 *)((long)&(other->_elem)._elem + 4);
      uVar4 = *(undefined4 *)((long)&(other->_elem)._elem + 8);
      uVar5 = *(undefined4 *)((long)&(other->_elem)._elem + 0xc);
      *(undefined4 *)&(this->_elem)._elem = *(undefined4 *)&(other->_elem)._elem;
      *(undefined4 *)((long)&(this->_elem)._elem + 4) = uVar3;
      *(undefined4 *)((long)&(this->_elem)._elem + 8) = uVar4;
      *(undefined4 *)((long)&(this->_elem)._elem + 0xc) = uVar5;
      (this->_elem)._elem.init._inner._core =
           (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::Literal_*>_>_>
            *)0x0;
    }
    else {
      *(int *)(plVar2 + 1) = (int)plVar2[1] + 1;
      local_28 = (undefined4)uVar6;
      uStack_24 = (undefined4)((ulong)uVar6 >> 0x20);
      uStack_20 = (undefined4)uVar7;
      uStack_1c = (undefined4)((ulong)uVar7 >> 0x20);
      *(undefined4 *)&(this->_elem)._elem = local_28;
      *(undefined4 *)((long)&(this->_elem)._elem + 4) = uStack_24;
      *(undefined4 *)((long)&(this->_elem)._elem + 8) = uStack_20;
      *(undefined4 *)((long)&(this->_elem)._elem + 0xc) = uStack_1c;
      *(long **)((long)&(this->_elem)._elem + 0x10) = plVar2;
      *(int *)(plVar2 + 1) = (int)plVar2[1] + 1;
      plVar1 = plVar2 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar2 + 8))();
      }
    }
  }
  this->_isSome = other->_isSome;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }